

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hammersley.cpp
# Opt level: O1

void __thiscall pm::Hammersley::generateSamples(Hammersley *this)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  float fVar6;
  Vector2 pv;
  value_type local_30;
  
  if ((this->super_Sampler).numSets_ != 0) {
    uVar3 = 0;
    do {
      uVar1 = (this->super_Sampler).numSamples_;
      if (uVar1 != 0) {
        uVar5 = 0;
        do {
          local_30.y = 0.0;
          if ((int)uVar5 != 0) {
            fVar6 = 0.5;
            uVar2 = uVar5;
            do {
              uVar4 = (uint)uVar2;
              local_30.y = local_30.y + (float)(uVar4 & 1) * fVar6;
              uVar2 = uVar2 >> 1;
              fVar6 = fVar6 * 0.5;
            } while (1 < uVar4);
          }
          local_30.x = (float)uVar5 / (float)uVar1;
          std::vector<pm::Vector2,_std::allocator<pm::Vector2>_>::push_back
                    (&(this->super_Sampler).samples_,&local_30);
          uVar4 = (int)uVar5 + 1;
          uVar5 = (ulong)uVar4;
          uVar1 = (this->super_Sampler).numSamples_;
        } while (uVar4 < uVar1);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->super_Sampler).numSets_);
  }
  return;
}

Assistant:

void Hammersley::generateSamples()
{
	for (unsigned int p = 0; p < numSets_; p++)
	{
		for (unsigned int j = 0; j < numSamples_; j++)
		{
			const Vector2 pv(static_cast<float>(j) / static_cast<float>(numSamples_), phi(j));
			samples_.push_back(pv);
		}
	}
}